

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionSettings.cpp
# Opt level: O3

void __thiscall FIX::SessionSettings::validate(SessionSettings *this,Dictionary *dictionary)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  ConfigError *pCVar4;
  long *plVar5;
  size_type *psVar6;
  string connectionType;
  string beginString;
  string local_b0;
  string local_90;
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  paVar1 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"BeginString","");
  Dictionary::getString(&local_70,dictionary,&local_90,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  iVar3 = std::__cxx11::string::compare((char *)&local_70);
  if (iVar3 != 0) {
    iVar3 = std::__cxx11::string::compare((char *)&local_70);
    if (iVar3 != 0) {
      iVar3 = std::__cxx11::string::compare((char *)&local_70);
      if (iVar3 != 0) {
        iVar3 = std::__cxx11::string::compare((char *)&local_70);
        if (iVar3 != 0) {
          iVar3 = std::__cxx11::string::compare((char *)&local_70);
          if (iVar3 != 0) {
            iVar3 = std::__cxx11::string::compare((char *)&local_70);
            if (iVar3 != 0) {
              pCVar4 = (ConfigError *)__cxa_allocate_exception(0x50);
              local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"BeginString","");
              plVar5 = (long *)std::__cxx11::string::append((char *)&local_b0);
              local_90._M_dataplus._M_p = (pointer)*plVar5;
              psVar6 = (size_type *)(plVar5 + 2);
              if ((size_type *)local_90._M_dataplus._M_p == psVar6) {
                local_90.field_2._M_allocated_capacity = *psVar6;
                local_90.field_2._8_8_ = plVar5[3];
                local_90._M_dataplus._M_p = (pointer)paVar1;
              }
              else {
                local_90.field_2._M_allocated_capacity = *psVar6;
              }
              local_90._M_string_length = plVar5[1];
              *plVar5 = (long)psVar6;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              ConfigError::ConfigError(pCVar4,&local_90);
              __cxa_throw(pCVar4,&ConfigError::typeinfo,FIX::Exception::~Exception);
            }
          }
        }
      }
    }
  }
  paVar2 = &local_b0.field_2;
  local_b0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"ConnectionType","");
  Dictionary::getString(&local_90,dictionary,&local_b0,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  iVar3 = std::__cxx11::string::compare((char *)&local_90);
  if (iVar3 != 0) {
    iVar3 = std::__cxx11::string::compare((char *)&local_90);
    if (iVar3 != 0) {
      pCVar4 = (ConfigError *)__cxa_allocate_exception(0x50);
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"ConnectionType","");
      plVar5 = (long *)std::__cxx11::string::append((char *)local_50);
      local_b0._M_dataplus._M_p = (pointer)*plVar5;
      psVar6 = (size_type *)(plVar5 + 2);
      if ((size_type *)local_b0._M_dataplus._M_p == psVar6) {
        local_b0.field_2._M_allocated_capacity = *psVar6;
        local_b0.field_2._8_8_ = plVar5[3];
        local_b0._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_b0.field_2._M_allocated_capacity = *psVar6;
      }
      local_b0._M_string_length = plVar5[1];
      *plVar5 = (long)psVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      ConfigError::ConfigError(pCVar4,&local_b0);
      __cxa_throw(pCVar4,&ConfigError::typeinfo,FIX::Exception::~Exception);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

EXCEPT(ConfigError) {
  std::string beginString = dictionary.getString(BEGINSTRING);
  if (beginString != BeginString_FIX40 && beginString != BeginString_FIX41 && beginString != BeginString_FIX42
      && beginString != BeginString_FIX43 && beginString != BeginString_FIX44 && beginString != BeginString_FIXT11) {
    throw ConfigError(std::string(BEGINSTRING) + " must be FIX.4.0 to FIX.4.4 or FIXT.1.1");
  }

  std::string connectionType = dictionary.getString(CONNECTION_TYPE);
  if (connectionType != "initiator" && connectionType != "acceptor") {
    throw ConfigError(std::string(CONNECTION_TYPE) + " must be 'initiator' or 'acceptor'");
  }
}